

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_get_buffer(JSContext *ctx,JSValue this_val,int is_dataview)

{
  JSValue v;
  JSValue this_val_00;
  JSObject *pJVar1;
  undefined4 in_ECX;
  JSContext *in_RDI;
  JSTypedArray *ta;
  JSObject *p;
  undefined8 in_stack_ffffffffffffffc0;
  JSContext *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  this_val_00.u._4_4_ = in_ECX;
  this_val_00.u.int32 = in_stack_ffffffffffffffd0;
  this_val_00.tag = (int64_t)in_RDI;
  pJVar1 = get_typed_array(in_stack_ffffffffffffffc8,this_val_00,
                           (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (pJVar1 == (JSObject *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    v.tag = -1;
    v.u = (JSValueUnion)(JSValueUnion)(((pJVar1->u).array_buffer)->array_list).next;
    _local_10 = JS_DupValue(in_RDI,v);
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_get_buffer(JSContext *ctx,
                                         JSValueConst this_val, int is_dataview)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, this_val, is_dataview);
    if (!p)
        return JS_EXCEPTION;
    ta = p->u.typed_array;
    return JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
}